

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptor.c
# Opt level: O3

void adapt_set_mllr(adapt_am_t *ad,mgau_model_t *g,char *mllrfile,char *cb2mllrname,mdef_t *mdef,
                   cmd_ln_t *config)

{
  int iVar1;
  char *pcVar2;
  long ln;
  int32 *nclass;
  float fVar3;
  double dVar4;
  int32 *cb2mllr;
  uint32 ncb;
  uint32 nmllr;
  int32 *local_58;
  uint32 local_4c;
  mdef_t *local_48;
  char *local_40;
  uint32 local_34;
  
  local_48 = mdef;
  local_40 = mllrfile;
  dVar4 = cmd_ln_float_r(config,"-varfloor");
  fVar3 = (float)dVar4;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/adaptor.c"
          ,0x73,"Reloading mean\n");
  pcVar2 = cmd_ln_str_r(config,"-mean");
  mgau_mean_reload(g,pcVar2);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/adaptor.c"
          ,0x77,"Reloading variance\n");
  pcVar2 = cmd_ln_str_r(config,"-var");
  mgau_var_reload(g,pcVar2);
  mgau_uninit_compact(g);
  if ((g->mgau->var != (float32 **)0x0) && (0.0 < fVar3)) {
    mgau_var_floor(g,(float64)(double)fVar3);
  }
  nclass = &ad->mllr_nclass;
  mllr_read_regmat(local_40,&ad->regA,&ad->regB,&ad->regH,nclass,g->veclen);
  if ((cb2mllrname != (char *)0x0) && (iVar1 = strcmp(cb2mllrname,".1cls."), iVar1 != 0)) {
    cb2mllr_read(cb2mllrname,&local_58,&local_4c,&local_34);
    if (local_34 == *nclass) {
      if (local_4c == local_48->n_sen) goto LAB_00105873;
      pcVar2 = "Number of senones in cb2mllr does not match mdef (%d != %d)\n";
      ln = 0x96;
    }
    else {
      pcVar2 = "Number of classes in cb2mllr does not match mllr (%d != %d)\n";
      ln = 0x92;
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/adaptor.c"
            ,ln,pcVar2);
    exit(1);
  }
  local_58 = (int32 *)0x0;
  local_34 = *nclass;
LAB_00105873:
  mllr_norm_mgau(g,ad->regA,ad->regB,ad->regH,local_34,local_58);
  ckd_free(local_58);
  if ((g->mgau->var != (float32 **)0x0) && (0.0 < fVar3)) {
    mgau_var_floor(g,(float64)(double)fVar3);
  }
  mgau_precomp(g);
  return;
}

Assistant:

void
adapt_set_mllr(adapt_am_t * ad, mgau_model_t * g, const char *mllrfile,
	       const char *cb2mllrname, mdef_t * mdef, cmd_ln_t *config)
{
    int32 *cb2mllr;
    float32 varfloor;
    
    varfloor = cmd_ln_float32_r(config, "-varfloor");

    /* Reread the gaussian mean from the file again */
    E_INFO("Reloading mean\n");
    mgau_mean_reload(g, cmd_ln_str_r(config, "-mean"));

    /* Reread the gaussian variance from the file again */
    E_INFO("Reloading variance\n");
    mgau_var_reload(g, cmd_ln_str_r(config, "-var"));

    mgau_uninit_compact(g);     /* Delete uninitialized components */

    if (g->mgau[0].var && varfloor > 0.0)
        mgau_var_floor(g, varfloor);    /* Variance floor after above compaction */

#if MLLR_DEBUG
    /*This generates huge amount of information */
    /*    mgau_dump(g,1); */
#endif

    /* Read in the mllr matrix */
    mllr_read_regmat(mllrfile,
                     &(ad->regA),
                     &(ad->regB),
		     &(ad->regH),
		     &(ad->mllr_nclass), mgau_veclen(g));

    if (cb2mllrname && strcmp(cb2mllrname, ".1cls.") != 0) {
        uint32 ncb, nmllr;

        cb2mllr_read(cb2mllrname, &cb2mllr, &ncb, &nmllr);
        if (nmllr != ad->mllr_nclass)
            E_FATAL
                ("Number of classes in cb2mllr does not match mllr (%d != %d)\n",
                 ncb, ad->mllr_nclass);
        if (ncb != mdef->n_sen)
            E_FATAL
                ("Number of senones in cb2mllr does not match mdef (%d != %d)\n",
                 ncb, mdef->n_sen);
    }
    else
        cb2mllr = NULL;

    /* Transform mean and variance vectors */
    mllr_norm_mgau(g, ad->regA, ad->regB, ad->regH, ad->mllr_nclass, cb2mllr);
    ckd_free(cb2mllr);

    if (g->mgau[0].var && varfloor > 0.0)
        mgau_var_floor(g, varfloor);    /* Variance floor after above transform */

    /* Re-precompute variance things */
    mgau_precomp(g);

#if MLLR_DEBUG
    /*#if 1 */
    mllr_dump(ad->regA, ad->regB, ad->regH, mgau_veclen(g), g->mllr_class, cb2mllr);
    /*This generates huge amount of information */
    /*mgau_dump(kbcore_mgau(kb->kbcore),1); */
#endif

}